

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

JSValue js_string_iterator_next
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,BOOL *pdone,int magic)

{
  int iVar1;
  JSValueUnion *pJVar2;
  JSValueUnion p_00;
  undefined1 auVar3 [16];
  uint uVar4;
  JSValueUnion JVar5;
  ulong uVar6;
  JSRefCountHeader *p;
  JSValue v;
  JSValue JVar7;
  JSValue JVar8;
  uint32_t idx;
  uint local_34;
  
  if ((((int)this_val.tag == -1) && (*(short *)((long)this_val.u.ptr + 6) == 0x26)) &&
     (pJVar2 = *(JSValueUnion **)((long)this_val.u.ptr + 0x30), pJVar2 != (JSValueUnion *)0x0)) {
    JVar5 = pJVar2[1];
    uVar4 = JVar5.int32;
    if (uVar4 != 3) {
      p_00 = (JSValueUnion)pJVar2->ptr;
      local_34 = *(uint *)((long)pJVar2 + 0x14);
      uVar6 = (ulong)local_34;
      if (local_34 < (*(uint *)((long)p_00.ptr + 4) & 0x7fffffff)) {
        uVar4 = string_getc((JSString *)p_00.ptr,(int *)&local_34);
        *(uint *)((long)pJVar2 + 0x14) = local_34;
        *pdone = 0;
        if (uVar4 < 0x10000) {
          JVar7 = js_new_string_char(ctx,(uint16_t)uVar4);
        }
        else {
          JVar5.ptr = js_alloc_string(ctx,2,1);
          if ((JSString *)JVar5.ptr == (JSString *)0x0) {
            JVar7 = (JSValue)(ZEXT816(6) << 0x40);
          }
          else {
            (((JSString *)((long)JVar5.ptr + 0x10))->header).ref_count =
                 *(int *)((long)p_00.ptr + uVar6 * 2 + 0x10);
            JVar7.tag = -7;
            JVar7.u.ptr = JVar5.ptr;
          }
        }
        uVar6 = (ulong)JVar7.u.ptr & 0xffffffff00000000;
        goto LAB_0016865d;
      }
      if ((0xfffffff4 < uVar4) && (iVar1 = *p_00.ptr, *(int *)p_00.ptr = iVar1 + -1, iVar1 < 2)) {
        v.tag = (int64_t)JVar5.ptr;
        v.u.ptr = p_00.ptr;
        __JS_FreeValueRT(ctx->rt,v);
      }
      pJVar2->int32 = 0;
      pJVar2[1].float64 = 1.48219693752374e-323;
    }
    *pdone = 1;
    uVar6 = 3;
  }
  else {
    JS_ThrowTypeErrorInvalidClass(ctx,0x26);
    *pdone = 0;
    uVar6 = 6;
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar6;
  JVar7 = (JSValue)(auVar3 << 0x40);
  uVar6 = 0;
LAB_0016865d:
  JVar8.tag = JVar7.tag;
  JVar8.u.ptr = (void *)((ulong)JVar7.u.ptr & 0xffffffff | uVar6);
  return JVar8;
}

Assistant:

static JSValue js_string_iterator_next(JSContext *ctx, JSValueConst this_val,
                                       int argc, JSValueConst *argv,
                                       BOOL *pdone, int magic)
{
    JSArrayIteratorData *it;
    uint32_t idx, c, start;
    JSString *p;

    it = JS_GetOpaque2(ctx, this_val, JS_CLASS_STRING_ITERATOR);
    if (!it) {
        *pdone = FALSE;
        return JS_EXCEPTION;
    }
    if (JS_IsUndefined(it->obj))
        goto done;
    p = JS_VALUE_GET_STRING(it->obj);
    idx = it->idx;
    if (idx >= p->len) {
        JS_FreeValue(ctx, it->obj);
        it->obj = JS_UNDEFINED;
    done:
        *pdone = TRUE;
        return JS_UNDEFINED;
    }

    start = idx;
    c = string_getc(p, (int *)&idx);
    it->idx = idx;
    *pdone = FALSE;
    if (c <= 0xffff) {
        return js_new_string_char(ctx, c);
    } else {
        return js_new_string16(ctx, p->u.str16 + start, 2);
    }
}